

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_remove_mapped_block
               (uc_struct_conflict15 *uc,MemoryRegion_conflict *mr,_Bool free)

{
  MemoryRegion **ppMVar1;
  long lVar2;
  uint uVar3;
  
  lVar2 = 0;
  while( true ) {
    if ((ulong)uc->mapped_block_count << 3 == lVar2) {
      return;
    }
    ppMVar1 = uc->mapped_blocks;
    if (*(MemoryRegion_conflict **)((long)ppMVar1 + lVar2) == mr) break;
    lVar2 = lVar2 + 8;
  }
  uVar3 = uc->mapped_block_count - 1;
  uc->mapped_block_count = uVar3;
  memmove((void *)((long)ppMVar1 + lVar2),(void *)((long)ppMVar1 + lVar2 + 8),
          (ulong)uVar3 * 8 - lVar2);
  if (!free) {
    return;
  }
  (*mr->destructor)((MemoryRegion *)mr);
  g_free(mr);
  return;
}

Assistant:

static void memory_region_remove_mapped_block(struct uc_struct *uc, MemoryRegion *mr, bool free)
{
    size_t i;
    for (i = 0; i < uc->mapped_block_count; i++) {
        if (uc->mapped_blocks[i] == mr) {
            uc->mapped_block_count--;
            //shift remainder of array down over deleted pointer
            memmove(&uc->mapped_blocks[i], &uc->mapped_blocks[i + 1], sizeof(MemoryRegion*) * (uc->mapped_block_count - i));
            if (free) {
                mr->destructor(mr);
                g_free(mr);
            }
            break;
        }
    }
}